

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O1

float * get_half_cos_window(int block_size)

{
  ulong uVar1;
  float *pfVar2;
  int x;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  double dVar6;
  double dVar7;
  
  uVar1 = (ulong)(uint)block_size;
  pfVar2 = (float *)aom_malloc((ulong)(uint)(block_size * block_size) << 2);
  if (pfVar2 == (float *)0x0) {
    pfVar2 = (float *)0x0;
  }
  else if (0 < block_size) {
    uVar4 = 0;
    pfVar5 = pfVar2;
    do {
      dVar6 = cos((((double)(int)uVar4 + 0.5) * 3.141592653589793) / (double)block_size +
                  -1.5707963267948966);
      uVar3 = 0;
      do {
        dVar7 = cos((((double)(int)uVar3 + 0.5) * 3.141592653589793) / (double)block_size +
                    -1.5707963267948966);
        pfVar5[uVar3] = (float)(dVar7 * dVar6);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      uVar4 = uVar4 + 1;
      pfVar5 = pfVar5 + uVar1;
    } while (uVar4 != uVar1);
  }
  return pfVar2;
}

Assistant:

static float *get_half_cos_window(int block_size) {
  float *window_function =
      (float *)aom_malloc(block_size * block_size * sizeof(*window_function));
  if (!window_function) return NULL;
  for (int y = 0; y < block_size; ++y) {
    const double cos_yd = cos((.5 + y) * PI / block_size - PI / 2);
    for (int x = 0; x < block_size; ++x) {
      const double cos_xd = cos((.5 + x) * PI / block_size - PI / 2);
      window_function[y * block_size + x] = (float)(cos_yd * cos_xd);
    }
  }
  return window_function;
}